

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::TextureCube::generate
          (TextureCube *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> data;
  GLenum dataType;
  IVec3 *context_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TextureCube *pTVar3;
  int *piVar4;
  TextureCube *pTVar5;
  PixelBufferAccess *access;
  TextureCube *in_stack_ffffffffffffff28;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *__return_storage_ptr__;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  CubeFace local_6c;
  DefaultDeleter<glu::TextureCube> local_65;
  int faceIndex;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> local_58;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *local_48;
  long local_38;
  Functions *gl;
  GLenum local_28;
  GLenum GStack_24;
  bool generateMipmaps_local;
  GLenum type_local;
  GLenum format_local;
  IVec3 *size_local;
  RenderContext *context_local;
  TextureCube *this_local;
  
  gl._7_1_ = generateMipmaps;
  local_28 = type;
  GStack_24 = format;
  _type_local = size;
  size_local = (IVec3 *)context;
  context_local = (RenderContext *)this;
  iVar1 = (*context->_vptr_RenderContext[3])();
  local_38 = CONCAT44(extraout_var,iVar1);
  pTVar3 = (TextureCube *)operator_new(0x180);
  context_00 = size_local;
  dVar2 = GStack_24;
  dataType = local_28;
  piVar4 = tcu::Vector<int,_3>::x(size);
  glu::TextureCube::TextureCube(pTVar3,(RenderContext *)context_00,dVar2,dataType,*piVar4);
  de::DefaultDeleter<glu::TextureCube>::DefaultDeleter(&local_65);
  __return_storage_ptr__ = &local_58;
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::MovePtr();
  local_48 = de::details::MovePtr::operator_cast_to_PtrData
                       (__return_storage_ptr__,(MovePtr *)pTVar3);
  data._8_8_ = __return_storage_ptr__;
  data.ptr = in_stack_ffffffffffffff28;
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::operator=
            (&this->m_texture,data);
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::~MovePtr
            ((MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *)&local_58);
  for (local_6c = CUBEFACE_NEGATIVE_X; (int)local_6c < 6; local_6c = local_6c + CUBEFACE_POSITIVE_X)
  {
    pTVar3 = de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::
             operator->(&(this->m_texture).
                         super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
    pTVar5 = glu::TextureCube::getRefTexture(pTVar3);
    tcu::TextureCube::allocLevel(pTVar5,local_6c,0);
    dVar2 = (**(code **)(local_38 + 0x800))();
    glu::checkError(dVar2,"glu::TextureCube error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x1c3);
    pTVar3 = de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::
             operator->(&(this->m_texture).
                         super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
    pTVar5 = glu::TextureCube::getRefTexture(pTVar3);
    access = tcu::TextureCube::getLevelFace(pTVar5,0,local_6c);
    tcu::Vector<float,_4>::Vector(&local_7c,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(&local_8c,0.0,0.0,0.0,1.0);
    tcu::fillWithGrid(access,4,&local_7c,&local_8c);
    dVar2 = (**(code **)(local_38 + 0x800))();
    glu::checkError(dVar2,"glu::TextureCube error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x1c7);
  }
  pTVar3 = de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
  glu::TextureCube::upload(pTVar3);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::TextureCube error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1cb);
  (**(code **)(local_38 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::TextureCube::generate(const glu::RenderContext& context, tcu::IVec3 size,
													 glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::TextureCube>(new glu::TextureCube(context, format, type, size.x()));

	for (int faceIndex = 0; faceIndex < tcu::CUBEFACE_LAST; ++faceIndex)
	{
		m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceIndex, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");

		tcu::fillWithGrid(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)faceIndex), 4,
						  tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");
	}

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");

	gl.activeTexture(GL_TEXTURE0);
}